

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_filesystem.cpp
# Opt level: O2

void full_tests(test_table *table)

{
  byte bVar1;
  long *string;
  int64_t iVar2;
  uint64_t uVar3;
  long *plVar4;
  char *pcVar5;
  char *pcVar6;
  uint64_t *puVar7;
  int32_t i;
  ne_filesystem_special_path nVar8;
  bool bVar9;
  ne_filesystem_open_info local_a0;
  ne_core_stream stream;
  
  puVar7 = table->result;
  if (puVar7 != (uint64_t *)0x0) {
    *puVar7 = 0;
  }
  string = (long *)(*ne_filesystem_get_scheme)(puVar7);
  if (string == (long *)0x0) {
    bVar9 = false;
  }
  else {
    bVar9 = (char)*string != '\0';
  }
  bVar1 = test_validate(bVar9,0,
                        "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test_filesystem/test_filesystem.cpp"
                        ,0x7c,"TEST_EXPECT(scheme != nullptr && *scheme != \'\\0\') failed\n");
  table->success = table->success & bVar1;
  iVar2 = ne_core_memory_compare(string,string,8);
  bVar1 = test_validate(iVar2 == 0,0,
                        "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test_filesystem/test_filesystem.cpp"
                        ,0x7e,
                        "TEST_EXPECT(ne_core_memory_compare(scheme, scheme, sizeof(uint64_t)) == 0) failed\n"
                       );
  table->success = table->success & bVar1;
  uVar3 = test_string_length((char *)string);
  bVar1 = test_validate(uVar3 < 0xffff,0,
                        "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test_filesystem/test_filesystem.cpp"
                        ,0x81,
                        "TEST_EXPECT(test_string_length(scheme) < static_cast<uint16_t>(-1)) failed\n"
                       );
  table->success = table->success & bVar1;
  if (table->result != (uint64_t *)0x0) {
    uVar3 = *table->result;
    bVar1 = test_validate(uVar3 == table->expected_result,uVar3,
                          "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test_filesystem/test_filesystem.cpp"
                          ,0x82,"TEST_EXPECT_RESULT(table->expected_result) failed\n");
    table->success = table->success & bVar1;
  }
  plVar4 = (long *)"Posix";
  if (string != (long *)0x0) {
    plVar4 = string;
  }
  if (*plVar4 == 0x73776f646e6957) {
    test_translate_paths(table,"/X:/test1/test2","X:\\test1\\test2");
    test_translate_paths(table,"/\\\\test1/test2","\\\\test1\\test2");
    test_translate_paths(table,"/\\\\?/test1/test2","\\\\?\\test1\\test2");
    test_translate_paths(table,"/\\\\./test1/test2","\\\\.\\test1\\test2");
    pcVar6 = "/C:";
    pcVar5 = "C:";
  }
  else {
    pcVar5 = "/test1/test2";
    pcVar6 = "/test1/test2";
  }
  test_translate_paths(table,pcVar6,pcVar5);
  for (nVar8 = ne_filesystem_special_path_directory_private; puVar7 = table->result,
      nVar8 != ne_filesystem_special_path_max;
      nVar8 = nVar8 + ne_filesystem_special_path_directory_temporary) {
    if (puVar7 != (uint64_t *)0x0) {
      *puVar7 = 0;
    }
    pcVar5 = (*ne_filesystem_get_special_path)(puVar7,nVar8);
    bVar9 = validate_universal_canonical_path(pcVar5);
    bVar1 = test_validate(bVar9,0,
                          "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test_filesystem/test_filesystem.cpp"
                          ,0xa1,
                          "TEST_EXPECT(validate_universal_canonical_path(universal_path)) failed\n")
    ;
    table->success = table->success & bVar1;
    puVar7 = (uint64_t *)0x0;
    if (table->result != (uint64_t *)0x0) {
      uVar3 = *table->result;
      bVar1 = test_validate(uVar3 == table->expected_result,uVar3,
                            "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test_filesystem/test_filesystem.cpp"
                            ,0xa2,"TEST_EXPECT_RESULT(table->expected_result) failed\n");
      table->success = table->success & bVar1;
      puVar7 = table->result;
      if (puVar7 == (uint64_t *)0x0) {
        puVar7 = (uint64_t *)0x0;
      }
      else {
        *puVar7 = 0;
      }
    }
    (*ne_core_free)(puVar7,pcVar5);
    if (table->result != (uint64_t *)0x0) {
      uVar3 = *table->result;
      bVar1 = test_validate(uVar3 == table->expected_result,uVar3,
                            "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test_filesystem/test_filesystem.cpp"
                            ,0xa6,"TEST_EXPECT_RESULT(table->expected_result) failed\n");
      table->success = table->success & bVar1;
    }
  }
  if (puVar7 != (uint64_t *)0x0) {
    *puVar7 = 0;
  }
  pcVar5 = (*ne_filesystem_get_special_path)(puVar7,ne_filesystem_special_path_directory_temporary);
  bVar9 = validate_universal_canonical_path(pcVar5);
  bVar1 = test_validate(bVar9,0,
                        "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test_filesystem/test_filesystem.cpp"
                        ,0xac,"TEST_EXPECT(validate_universal_canonical_path(directory)) failed\n");
  table->success = table->success & bVar1;
  if (table->result != (uint64_t *)0x0) {
    uVar3 = *table->result;
    bVar1 = test_validate(uVar3 == table->expected_result,uVar3,
                          "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test_filesystem/test_filesystem.cpp"
                          ,0xad,"TEST_EXPECT_RESULT(table->expected_result) failed\n");
    table->success = table->success & bVar1;
  }
  pcVar6 = test_concatenate_allocate(pcVar5,"/test.txt");
  bVar9 = validate_universal_canonical_path(pcVar6);
  bVar1 = test_validate(bVar9,0,
                        "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test_filesystem/test_filesystem.cpp"
                        ,0xb2,"TEST_EXPECT(validate_universal_canonical_path(path)) failed\n");
  table->success = table->success & bVar1;
  puVar7 = table->result;
  if (puVar7 != (uint64_t *)0x0) {
    *puVar7 = 0;
  }
  (*ne_core_free)(puVar7,pcVar5);
  if (table->result != (uint64_t *)0x0) {
    uVar3 = *table->result;
    bVar1 = test_validate(uVar3 == table->expected_result,uVar3,
                          "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test_filesystem/test_filesystem.cpp"
                          ,0xb6,"TEST_EXPECT_RESULT(table->expected_result) failed\n");
    table->success = table->success & bVar1;
  }
  ne_core_memory_set(&local_a0,0xcd,0x20);
  local_a0.io = ne_filesystem_io_write;
  local_a0.if_file_exists = ne_filesystem_if_file_exists_truncate;
  local_a0.if_none_exists = ne_filesystem_if_none_exists_create;
  local_a0.share_flags = ne_filesystem_share_flags_none;
  local_a0.open_flags = ne_filesystem_open_flags_none;
  local_a0.universal_path = pcVar6;
  ne_core_memory_set(&stream,0xcd,0x50);
  puVar7 = table->result;
  if (puVar7 != (uint64_t *)0x0) {
    *puVar7 = 0;
  }
  (*ne_filesystem_open_file)(puVar7,&local_a0,&stream);
  if (table->result != (uint64_t *)0x0) {
    uVar3 = *table->result;
    bVar1 = test_validate(uVar3 == table->expected_result,uVar3,
                          "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test_filesystem/test_filesystem.cpp"
                          ,0xc6,"TEST_EXPECT_RESULT(table->expected_result) failed\n");
    table->success = table->success & bVar1;
  }
  bVar1 = test_validate(stream.read ==
                        (_func_uint64_t_uint64_t_ptr_ne_core_stream_ptr_void_ptr_uint64_t_ne_core_bool
                         *)0x0,0,
                        "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test_filesystem/test_filesystem.cpp"
                        ,200,"TEST_EXPECT(stream.read == NE_CORE_NULL) failed\n");
  table->success = table->success & bVar1;
  bVar1 = test_validate(stream.write !=
                        (_func_uint64_t_uint64_t_ptr_ne_core_stream_ptr_void_ptr_uint64_t_ne_core_bool
                         *)0x0,0,
                        "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test_filesystem/test_filesystem.cpp"
                        ,0xc9,"TEST_EXPECT(stream.write != NE_CORE_NULL) failed\n");
  table->success = table->success & bVar1;
  bVar1 = test_validate(stream.flush != (_func_void_uint64_t_ptr_ne_core_stream_ptr *)0x0,0,
                        "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test_filesystem/test_filesystem.cpp"
                        ,0xca,"TEST_EXPECT(stream.flush != NE_CORE_NULL) failed\n");
  table->success = table->success & bVar1;
  bVar1 = test_validate(stream.get_position != (_func_uint64_t_uint64_t_ptr_ne_core_stream_ptr *)0x0
                        ,0,
                        "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test_filesystem/test_filesystem.cpp"
                        ,0xcb,"TEST_EXPECT(stream.get_position != NE_CORE_NULL) failed\n");
  table->success = table->success & bVar1;
  bVar1 = test_validate(stream.get_size != (_func_uint64_t_uint64_t_ptr_ne_core_stream_ptr *)0x0,0,
                        "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test_filesystem/test_filesystem.cpp"
                        ,0xcc,"TEST_EXPECT(stream.get_size != NE_CORE_NULL) failed\n");
  table->success = table->success & bVar1;
  bVar1 = test_validate(stream.seek !=
                        (_func_uint64_t_uint64_t_ptr_ne_core_stream_ptr_ne_core_stream_seek_origin_int64_t
                         *)0x0,0,
                        "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test_filesystem/test_filesystem.cpp"
                        ,0xcd,"TEST_EXPECT(stream.seek != NE_CORE_NULL) failed\n");
  table->success = table->success & bVar1;
  bVar1 = test_validate(stream.is_valid != (_func_ne_core_bool_uint64_t_ptr_ne_core_stream_ptr *)0x0
                        ,0,
                        "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test_filesystem/test_filesystem.cpp"
                        ,0xce,"TEST_EXPECT(stream.is_valid != NE_CORE_NULL) failed\n");
  table->success = table->success & bVar1;
  bVar1 = test_validate(stream.free != (_func_void_uint64_t_ptr_ne_core_stream_ptr *)0x0,0,
                        "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test_filesystem/test_filesystem.cpp"
                        ,0xcf,"TEST_EXPECT(stream.free != NE_CORE_NULL) failed\n");
  table->success = table->success & bVar1;
  test_stream(table,&stream,'\x01');
  puVar7 = table->result;
  if (puVar7 != (uint64_t *)0x0) {
    *puVar7 = 0;
  }
  (*ne_core_free)(puVar7,pcVar6);
  if (table->result != (uint64_t *)0x0) {
    uVar3 = *table->result;
    bVar1 = test_validate(uVar3 == table->expected_result,uVar3,
                          "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test_filesystem/test_filesystem.cpp"
                          ,0xd5,"TEST_EXPECT_RESULT(table->expected_result) failed\n");
    table->success = table->success & bVar1;
  }
  return;
}

Assistant:

static void full_tests(test_table *table)
{
  // TODO(Trevor.Sundberg) We should test relative paths, but we would need to
  // control the working directory. Most likely we'd set POSIX systems to '/'
  // and Windows to the system drive, like 'C:'.

  TEST_CLEAR_RESULT();
  const char *scheme = ne_filesystem_get_scheme(table->result);
  TEST_EXPECT(scheme != nullptr && *scheme != '\0');
  // Read the 8 bytes to help ensure it's readable memory.
  TEST_EXPECT(ne_core_memory_compare(scheme, scheme, sizeof(uint64_t)) == 0);
  // Make sure the string is a reasonable length and doesn't run off the end
  // without a null terminator.
  TEST_EXPECT(test_string_length(scheme) < static_cast<uint16_t>(-1));
  TEST_EXPECT_TABLE_RESULT();

  uint64_t scheme_id = *reinterpret_cast<const uint64_t *>(
      scheme != nullptr ? scheme : NE_FILESYSTEM_SCHEME_POSIX);

  // All other platforms except Windows use the same path scheme.
  if (scheme_id ==
      *reinterpret_cast<const uint64_t *>(NE_FILESYSTEM_SCHEME_WINDOWS))
  {
    // Absolute paths.
    test_translate_paths(table, R"(/X:/test1/test2)", R"(X:\test1\test2)");
    // Network paths.
    test_translate_paths(table, R"(/\\test1/test2)", R"(\\test1\test2)");
    // UNC paths.
    test_translate_paths(table, R"(/\\?/test1/test2)", R"(\\?\test1\test2)");
    // Device paths.
    test_translate_paths(table, R"(/\\./test1/test2)", R"(\\.\test1\test2)");
    // Drive paths.
    test_translate_paths(table, R"(/C:)", R"(C:)");
  }
  else
  {
    // Absolute paths.
    test_translate_paths(table, R"(/test1/test2)", R"(/test1/test2)");
  }

  for (int32_t i = 0; i != ne_filesystem_special_path_max; ++i)
  {
    TEST_CLEAR_RESULT();
    char *universal_path = ne_filesystem_get_special_path(
        table->result, static_cast<ne_filesystem_special_path>(i));
    TEST_EXPECT(validate_universal_canonical_path(universal_path));
    TEST_EXPECT_TABLE_RESULT();

    TEST_CLEAR_RESULT();
    ne_core_free(table->result, universal_path);
    TEST_EXPECT_TABLE_RESULT();
  }

  TEST_CLEAR_RESULT();
  char *directory = ne_filesystem_get_special_path(
      table->result, ne_filesystem_special_path_directory_temporary);
  TEST_EXPECT(validate_universal_canonical_path(directory));
  TEST_EXPECT_TABLE_RESULT();

  // TODO(Trevor.Sundberg): Must check directory existance or create it.

  char *path = test_concatenate_allocate(directory, "/test.txt");
  TEST_EXPECT(validate_universal_canonical_path(path));

  TEST_CLEAR_RESULT();
  ne_core_free(table->result, directory);
  TEST_EXPECT_TABLE_RESULT();

  ne_filesystem_open_info info;
  ne_core_memory_set(&info, NE_CORE_UNINITIALIZED_BYTE, sizeof(info));

  info.universal_path = path;
  info.io = ne_filesystem_io_write;
  info.if_file_exists = ne_filesystem_if_file_exists_truncate;
  info.if_none_exists = ne_filesystem_if_none_exists_create;
  info.share_flags = ne_filesystem_share_flags_none;
  info.open_flags = ne_filesystem_open_flags_none;

  ne_core_stream stream;
  ne_core_memory_set(&stream, NE_CORE_UNINITIALIZED_BYTE, sizeof(stream));
  TEST_CLEAR_RESULT();
  ne_filesystem_open_file(table->result, &info, &stream);
  TEST_EXPECT_TABLE_RESULT();

  TEST_EXPECT(stream.read == NE_CORE_NULL);
  TEST_EXPECT(stream.write != NE_CORE_NULL);
  TEST_EXPECT(stream.flush != NE_CORE_NULL);
  TEST_EXPECT(stream.get_position != NE_CORE_NULL);
  TEST_EXPECT(stream.get_size != NE_CORE_NULL);
  TEST_EXPECT(stream.seek != NE_CORE_NULL);
  TEST_EXPECT(stream.is_valid != NE_CORE_NULL);
  TEST_EXPECT(stream.free != NE_CORE_NULL);

  test_stream(table, &stream, NE_CORE_TRUE);

  TEST_CLEAR_RESULT();
  ne_core_free(table->result, path);
  TEST_EXPECT_TABLE_RESULT();
}